

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O1

void Acb_ObjRemoveBufInv(Acb_Ntk_t *p,int iObj)

{
  ulong uVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  word *pwVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  char *__assertion;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  int *piVar22;
  bool bVar23;
  
  if (iObj < 1) {
    __assertion = "i>0";
  }
  else {
    iVar20 = (p->vObjTruth).nSize;
    if (0 < iVar20) {
      if (iVar20 <= iObj) {
LAB_003aa0f0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if ((p->vObjType).nSize <= iObj) {
LAB_003aa055:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (0xfd < (byte)((p->vObjType).pArray[(uint)iObj] - 5U)) {
        __assert_fail("!Acb_ObjIsCio(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                      ,0xe0,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iObj) goto LAB_003aa0b2;
      iVar20 = (p->vObjFans).pArray[(uint)iObj];
      if (((long)iVar20 < 0) || ((p->vFanSto).nSize <= iVar20)) goto LAB_003aa093;
      if ((p->vFanSto).pArray[iVar20] != 1) {
        __assert_fail("Acb_ObjFaninNum(p, iObj) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                      ,0xe1,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
      }
      uVar19 = (p->vObjTruth).pArray[(uint)iObj];
      if ((uVar19 != 0xaaaaaaaaaaaaaaaa) && (uVar19 != 0x5555555555555555)) {
        __assert_fail("uTruth == s_Truths6[0] || ~uTruth == s_Truths6[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                      ,0xe2,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
      }
      iVar20 = (p->vFanouts).nSize;
      while (iObj < iVar20) {
        pVVar5 = (p->vFanouts).pArray;
        uVar17 = pVVar5[(uint)iObj].nSize;
        if (0 < (int)uVar17) {
          uVar12 = 0;
          while( true ) {
            uVar21 = pVVar5[(uint)iObj].pArray[uVar12];
            if ((long)(int)uVar21 < 1) break;
            if ((p->vObjType).nSize <= (int)uVar21) goto LAB_003aa055;
            uVar13 = (uint)(byte)(p->vObjType).pArray[(int)uVar21];
            if ((4 < uVar13) || ((0x19U >> (uVar13 & 0x1f) & 1) == 0)) goto LAB_003a9cbf;
            uVar12 = uVar12 + 1;
            if (uVar17 == uVar12) goto LAB_003a9cb9;
          }
          goto LAB_003aa074;
        }
LAB_003a9cb9:
        uVar21 = 0xffffffff;
LAB_003a9cbf:
        if ((int)uVar21 < 0) goto LAB_003a9e9c;
        iVar20 = (p->vObjFans).nSize;
        if (iVar20 <= iObj) goto LAB_003aa0b2;
        piVar6 = (p->vObjFans).pArray;
        iVar3 = piVar6[(uint)iObj];
        if (((long)iVar3 < 0) || (iVar4 = (p->vFanSto).nSize, iVar4 <= iVar3)) goto LAB_003aa093;
        if (iVar20 <= (int)uVar21) goto LAB_003aa0b2;
        iVar20 = piVar6[uVar21];
        if (((long)iVar20 < 0) || (iVar4 <= iVar20)) goto LAB_003aa093;
        piVar6 = (p->vFanSto).pArray;
        puVar2 = (uint *)(piVar6 + iVar20);
        uVar17 = *puVar2;
        uVar12 = (ulong)uVar17;
        if ((int)uVar17 < 1) {
          uVar12 = 0;
        }
        uVar14 = 0;
        do {
          if (uVar12 == uVar14) {
            iVar20 = -1;
            goto LAB_003a9d56;
          }
          uVar1 = uVar14 + 1;
          lVar15 = uVar14 + 1;
          uVar14 = uVar1;
        } while (puVar2[lVar15] != iObj);
        iVar20 = (int)uVar1 + -1;
LAB_003a9d56:
        Acb_ObjPatchFanin(p,uVar21,iObj,piVar6[(long)iVar3 + 1]);
        if ((uVar19 & 1) != 0) {
          iVar3 = (p->vObjTruth).nSize;
          if (iVar3 < 1) goto LAB_003aa0d1;
          if (iVar3 <= (int)uVar21) goto LAB_003aa0f0;
          if ((p->vObjTruth).nSize <= (int)uVar21) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                          ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
          }
          pwVar7 = (p->vObjTruth).pArray;
          uVar12 = pwVar7[uVar21];
          bVar11 = (byte)(1 << ((byte)iVar20 & 0x1f));
          pwVar7[uVar21] =
               uVar12 << (bVar11 & 0x3f) & s_Truths6[iVar20] |
               (uVar12 & s_Truths6[iVar20]) >> (bVar11 & 0x3f);
        }
        Acb_ObjRemoveDupFanins(p,uVar21);
        iVar20 = (p->vFanouts).nSize;
      }
      goto LAB_003a9de7;
    }
LAB_003aa0d1:
    __assertion = "Acb_NtkHasObjTruths(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
LAB_003a9e9c:
  if ((uVar19 & 1) != 0) goto LAB_003a9ea7;
  if ((p->vFanouts).nSize <= iObj) goto LAB_003a9de7;
  pVVar5 = (p->vFanouts).pArray;
  if (pVVar5[(uint)iObj].nSize < 1) goto LAB_003a9ea7;
  if ((p->vObjFans).nSize <= iObj) goto LAB_003aa0b2;
  iVar20 = (p->vObjFans).pArray[(uint)iObj];
  if (((long)iVar20 < 0) || ((p->vFanSto).nSize <= iVar20)) goto LAB_003aa093;
  if (pVVar5[(uint)iObj].nSize < 1) goto LAB_003aa0b2;
  iVar3 = *pVVar5[(uint)iObj].pArray;
  if ((long)iVar3 < 1) {
LAB_003aa074:
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= iVar3) goto LAB_003aa055;
  if ((p->vObjType).pArray[iVar3] != '\x04') {
    __assert_fail("Acb_ObjIsCo(p, iFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0xf3,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
  }
  Acb_ObjPatchFanin(p,iVar3,iObj,(p->vFanSto).pArray[(long)iVar20 + 1]);
  goto LAB_003a9e9c;
LAB_003a9ea7:
  if ((p->vFanouts).nSize <= iObj) {
LAB_003a9de7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar5 = (p->vFanouts).pArray;
  if (pVVar5[(uint)iObj].nSize != 0) {
    return;
  }
  if ((p->vObjFans).nSize <= iObj) {
LAB_003aa0b2:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar6 = (p->vObjFans).pArray;
  iVar20 = piVar6[(uint)iObj];
  lVar15 = (long)iVar20;
  if ((-1 < lVar15) && (iVar20 < (p->vFanSto).nSize)) {
    piVar8 = (p->vFanSto).pArray;
    if (0 < piVar8[lVar15]) {
      lVar16 = 0;
      do {
        iVar20 = (piVar8 + lVar15)[lVar16 + 1];
        lVar18 = (long)iVar20;
        if ((lVar18 < 0) || ((p->vFanouts).nSize <= iVar20)) goto LAB_003a9de7;
        uVar17 = pVVar5[lVar18].nSize;
        uVar19 = 0;
        bVar23 = 0 < (int)uVar17;
        if (0 < (int)uVar17) {
          bVar23 = true;
          if (*pVVar5[lVar18].pArray != iObj) {
            uVar12 = 0;
            do {
              if ((ulong)uVar17 - 1 == uVar12) {
                bVar23 = false;
                uVar19 = (ulong)uVar17;
                goto LAB_003a9f76;
              }
              uVar19 = uVar12 + 1;
              lVar10 = uVar12 + 1;
              uVar12 = uVar19;
            } while (pVVar5[lVar18].pArray[lVar10] != iObj);
            bVar23 = uVar19 < uVar17;
          }
        }
LAB_003a9f76:
        if ((uint)uVar19 == uVar17) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                        ,0x223,"void Acb_ObjRemoveFaninFanout(Acb_Ntk_t *, int)");
        }
        if (!bVar23) {
          __assert_fail("i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
        }
        uVar21 = (uint)uVar19 + 1;
        if ((int)uVar21 < (int)uVar17) {
          piVar9 = pVVar5[lVar18].pArray;
          piVar22 = piVar9 + uVar21;
          do {
            iVar20 = (int)uVar19;
            piVar9[uVar19 & 0xffffffff] = *piVar22;
            uVar17 = pVVar5[lVar18].nSize;
            uVar19 = (ulong)(iVar20 + 1);
            piVar22 = piVar22 + 1;
          } while (iVar20 + 2 < (int)uVar17);
        }
        lVar16 = lVar16 + 1;
        pVVar5[lVar18].nSize = uVar17 - 1;
      } while (lVar16 < piVar8[lVar15]);
    }
    if ((p->vObjFans).nSize <= iObj) goto LAB_003aa0b2;
    iVar20 = piVar6[(uint)iObj];
    lVar15 = (long)iVar20;
    if ((-1 < lVar15) && (iVar20 < (p->vFanSto).nSize)) {
      if (0 < piVar8[lVar15]) {
        lVar16 = 0;
        do {
          if (piVar8[lVar15 + lVar16 + 1] < 1) {
            __assert_fail("pFanins[i] > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                          ,0x1c8,"void Acb_ObjRemoveFanins(Acb_Ntk_t *, int)");
          }
          piVar8[lVar15 + lVar16 + 1] = -1;
          lVar16 = lVar16 + 1;
        } while (lVar16 < piVar8[lVar15]);
      }
      piVar8[lVar15] = 0;
      if (iObj < (p->vObjType).nSize) {
        (p->vObjType).pArray[(uint)iObj] = '\0';
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                    ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
    }
  }
LAB_003aa093:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

void Acb_ObjRemoveBufInv( Acb_Ntk_t * p, int iObj )
{
    int iFanout;
    word uTruth = Acb_ObjTruth( p, iObj );
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( Acb_ObjFaninNum(p, iObj) == 1 );
    assert( uTruth == s_Truths6[0] || ~uTruth == s_Truths6[0] );
    while ( (iFanout = Acb_ObjFindNodeFanout(p, iObj)) >= 0 )
    {
        int iFanin = Acb_ObjFanin( p, iObj, 0 );
        int iObjIndex = Acb_ObjWhatFanin( p, iFanout, iObj );
        Acb_ObjPatchFanin( p, iFanout, iObj, iFanin );
        if ( uTruth & 1 ) // inv
        {
            word uTruthF = Acb_ObjTruth( p, iFanout );
            Vec_WrdWriteEntry( &p->vObjTruth, iFanout, Abc_Tt6Flip(uTruthF, iObjIndex) );
        }
        Acb_ObjRemoveDupFanins( p, iFanout );
    }
    while ( (uTruth & 1) == 0 && Acb_ObjFanoutNum(p, iObj) > 0 )
    {
        int iFanin = Acb_ObjFanin( p, iObj, 0 );
        int iFanout = Acb_ObjFanout( p, iObj, 0 );
        assert( Acb_ObjIsCo(p, iFanout) );
        Acb_ObjPatchFanin( p, iFanout, iObj, iFanin );
    }
    if ( Acb_ObjFanoutNum(p, iObj) == 0 )
    {
        Acb_ObjRemoveFaninFanout( p, iObj );
        Acb_ObjRemoveFanins( p, iObj );
        Acb_ObjCleanType( p, iObj );
    }
}